

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

int Gla_ManGetVar(Gla_Man_t *p,int iObj,int iFrame)

{
  int Fill;
  Gla_Obj_t *pGVar1;
  int iVar2;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
  }
  if (iObj == 0) {
    pGVar1 = (Gla_Obj_t *)0x0;
  }
  else {
    pGVar1 = p->pObjs + (uint)iObj;
  }
  Vec_IntFillExtra(&pGVar1->vFrames,iFrame + 1,iFrame);
  if ((-1 < iFrame) && (iFrame < (pGVar1->vFrames).nSize)) {
    if ((pGVar1->field_0x4 & 0x50) != 0) {
      __assert_fail("!pGla->fPo && !pGla->fRi",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0x51d,"int Gla_ManGetVar(Gla_Man_t *, int, int)");
    }
    iVar2 = (pGVar1->vFrames).pArray[(uint)iFrame];
    if (iVar2 == 0) {
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      Vec_IntFillExtra(&pGVar1->vFrames,iFrame + 1,Fill);
      if ((pGVar1->vFrames).nSize <= iFrame) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pGVar1->vFrames).pArray[(uint)iFrame] = iVar2;
      Vec_IntPush(p->vAddedNew,iObj);
      Vec_IntPush(p->vAddedNew,iFrame);
    }
    return iVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gla_ManGetVar( Gla_Man_t * p, int iObj, int iFrame )
{
    Gla_Obj_t * pGla = Gla_ManObj( p, iObj );
    int iVar = Vec_IntGetEntry( &pGla->vFrames, iFrame );
    assert( !pGla->fPo && !pGla->fRi );
    if ( iVar == 0 )
    {
        Vec_IntSetEntry( &pGla->vFrames, iFrame, (iVar = p->nSatVars++) );
        // remember the change
        Vec_IntPush( p->vAddedNew, iObj );
        Vec_IntPush( p->vAddedNew, iFrame );
    }
    return iVar;
}